

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_matrix.cpp
# Opt level: O3

Reals __thiscall Omega_h::symms_osh2inria_dim<1>(Omega_h *this,Reals *symms)

{
  int *piVar1;
  Alloc *pAVar2;
  _Alloc_hider _Var3;
  undefined8 uVar4;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *pvVar5;
  ulong uVar6;
  LO n;
  Reals RVar7;
  Write<double> out;
  type f;
  Write<double> local_68;
  string local_58;
  Write<double> local_38;
  
  pAVar2 = (symms->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    uVar6 = pAVar2->size;
    n = (LO)(uVar6 >> 3);
  }
  else {
    n = (LO)((ulong)pAVar2 >> 6);
    uVar6 = (ulong)pAVar2 >> 3;
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
  Write<double>::Write(&local_68,(LO)(uVar6 >> 3),&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_58._M_dataplus._M_p = (pointer)(symms->write_).shared_alloc_.alloc;
  if (((ulong)local_58._M_dataplus._M_p & 7) == 0 &&
      (Alloc *)local_58._M_dataplus._M_p != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_58._M_dataplus._M_p = (pointer)(((Alloc *)local_58._M_dataplus._M_p)->size * 8 + 1);
    }
    else {
      ((Alloc *)local_58._M_dataplus._M_p)->use_count =
           ((Alloc *)local_58._M_dataplus._M_p)->use_count + 1;
    }
  }
  local_58._M_string_length = (size_type)(symms->write_).shared_alloc_.direct_ptr;
  local_58.field_2._M_allocated_capacity = (size_type)local_68.shared_alloc_.alloc;
  if (((ulong)local_68.shared_alloc_.alloc & 7) == 0 && local_68.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_58.field_2._M_allocated_capacity = (local_68.shared_alloc_.alloc)->size * 8 + 1;
    }
    else {
      (local_68.shared_alloc_.alloc)->use_count = (local_68.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_58.field_2._8_8_ = local_68.shared_alloc_.direct_ptr;
  parallel_for<Omega_h::symms_osh2inria_dim<1>(Omega_h::Read<double>)::_lambda(int)_1_&>
            (n,(type *)&local_58);
  local_38.shared_alloc_.alloc = local_68.shared_alloc_.alloc;
  local_38.shared_alloc_.direct_ptr = local_68.shared_alloc_.direct_ptr;
  if ((((ulong)local_68.shared_alloc_.alloc & 7) == 0 &&
       local_68.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_68.shared_alloc_.alloc)->use_count = (local_68.shared_alloc_.alloc)->use_count + -1;
    local_38.shared_alloc_.alloc = (Alloc *)((local_68.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_68.shared_alloc_.alloc = (Alloc *)0x0;
  local_68.shared_alloc_.direct_ptr = (void *)0x0;
  Read<double>::Read((Read<signed_char> *)this,&local_38);
  pAVar2 = local_38.shared_alloc_.alloc;
  pvVar5 = extraout_RDX;
  if (((ulong)local_38.shared_alloc_.alloc & 7) == 0 && local_38.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_38.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_38.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar5 = extraout_RDX_00;
    }
  }
  uVar4 = local_58.field_2._M_allocated_capacity;
  if ((local_58.field_2._M_allocated_capacity & 7) == 0 &&
      (Alloc *)local_58.field_2._M_allocated_capacity != (Alloc *)0x0) {
    piVar1 = (int *)(local_58.field_2._M_allocated_capacity + 0x30);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)local_58.field_2._M_allocated_capacity);
      operator_delete((void *)uVar4,0x48);
      pvVar5 = extraout_RDX_01;
    }
  }
  _Var3._M_p = local_58._M_dataplus._M_p;
  if (((ulong)local_58._M_dataplus._M_p & 7) == 0 &&
      (Alloc *)local_58._M_dataplus._M_p != (Alloc *)0x0) {
    piVar1 = (int *)(local_58._M_dataplus._M_p + 0x30);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)local_58._M_dataplus._M_p);
      operator_delete(_Var3._M_p,0x48);
      pvVar5 = extraout_RDX_02;
    }
  }
  pAVar2 = local_68.shared_alloc_.alloc;
  if (((ulong)local_68.shared_alloc_.alloc & 7) == 0 && local_68.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_68.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_68.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar5 = extraout_RDX_03;
    }
  }
  RVar7.write_.shared_alloc_.direct_ptr = pvVar5;
  RVar7.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar7.write_.shared_alloc_;
}

Assistant:

Reals symms_osh2inria_dim(Reals symms) {
  auto n = divide_no_remainder(symms.size(), symm_ncomps(dim));
  Write<Real> out(symms.size());
  auto f = OMEGA_H_LAMBDA(LO i) {
    auto iv = get_vector<symm_ncomps(dim)>(symms, i);
    auto is = vector2symm(iv);
    auto ov = symm2vector_inria(is);
    set_vector(out, i, ov);
  };
  parallel_for(n, f);
  return out;
}